

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise3d.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise3D::load_param(DeconvolutionDepthWise3D *this,ParamDict *pd)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  Mat local_b8;
  Mat local_68;
  
  iVar3 = ParamDict::get(pd,0,0);
  this->num_output = iVar3;
  iVar3 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar3;
  iVar3 = ParamDict::get(pd,0xb,iVar3);
  this->kernel_h = iVar3;
  iVar3 = ParamDict::get(pd,0x15,this->kernel_w);
  this->kernel_d = iVar3;
  iVar3 = ParamDict::get(pd,2,1);
  this->dilation_w = iVar3;
  iVar3 = ParamDict::get(pd,0xc,iVar3);
  this->dilation_h = iVar3;
  iVar3 = ParamDict::get(pd,0x16,this->dilation_w);
  this->dilation_d = iVar3;
  iVar3 = ParamDict::get(pd,3,1);
  this->stride_w = iVar3;
  iVar3 = ParamDict::get(pd,0xd,iVar3);
  this->stride_h = iVar3;
  iVar3 = ParamDict::get(pd,0x17,this->stride_w);
  this->stride_d = iVar3;
  iVar3 = ParamDict::get(pd,4,0);
  this->pad_left = iVar3;
  iVar3 = ParamDict::get(pd,0xf,iVar3);
  this->pad_right = iVar3;
  iVar3 = ParamDict::get(pd,0xe,this->pad_left);
  this->pad_top = iVar3;
  iVar3 = ParamDict::get(pd,0x10,iVar3);
  this->pad_bottom = iVar3;
  iVar3 = ParamDict::get(pd,0x18,this->pad_left);
  this->pad_front = iVar3;
  iVar3 = ParamDict::get(pd,0x11,iVar3);
  this->pad_behind = iVar3;
  iVar3 = ParamDict::get(pd,0x12,0);
  this->output_pad_right = iVar3;
  iVar3 = ParamDict::get(pd,0x13,iVar3);
  this->output_pad_bottom = iVar3;
  iVar3 = ParamDict::get(pd,0x14,this->output_pad_right);
  this->output_pad_behind = iVar3;
  iVar3 = ParamDict::get(pd,0x19,0);
  this->output_w = iVar3;
  iVar3 = ParamDict::get(pd,0x1a,iVar3);
  this->output_h = iVar3;
  iVar3 = ParamDict::get(pd,0x1b,this->output_w);
  this->output_d = iVar3;
  iVar3 = ParamDict::get(pd,5,0);
  this->bias_term = iVar3;
  iVar3 = ParamDict::get(pd,6,0);
  this->weight_data_size = iVar3;
  iVar3 = ParamDict::get(pd,7,1);
  this->group = iVar3;
  iVar3 = ParamDict::get(pd,9,0);
  this->activation_type = iVar3;
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b8,pd,10,&local_68);
  if (&this->activation_params != &local_b8) {
    piVar1 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->activation_params).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = (this->activation_params).data;
        pAVar2 = (this->activation_params).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->activation_params).cstep = 0;
    *(undefined8 *)((long)&(this->activation_params).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->activation_params).elemsize + 4) = 0;
    (this->activation_params).data = (void *)0x0;
    (this->activation_params).refcount = (int *)0x0;
    (this->activation_params).dims = 0;
    (this->activation_params).w = 0;
    (this->activation_params).h = 0;
    (this->activation_params).d = 0;
    (this->activation_params).c = 0;
    (this->activation_params).data = local_b8.data;
    (this->activation_params).refcount =
         (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->activation_params).elemsize =
         CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->activation_params).elempack = local_b8.elempack;
    (this->activation_params).allocator = local_b8.allocator;
    (this->activation_params).dims = local_b8.dims;
    (this->activation_params).w = local_b8.w;
    (this->activation_params).h = local_b8.h;
    (this->activation_params).d = local_b8.d;
    (this->activation_params).c = local_b8.c;
    (this->activation_params).cstep = local_b8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  piVar1 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (*(local_68.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise3D::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    kernel_d = pd.get(21, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    dilation_d = pd.get(22, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    stride_d = pd.get(23, stride_w);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_top = pd.get(14, pad_left);
    pad_bottom = pd.get(16, pad_top);
    pad_front = pd.get(24, pad_left);
    pad_behind = pd.get(17, pad_front);
    output_pad_right = pd.get(18, 0);
    output_pad_bottom = pd.get(19, output_pad_right);
    output_pad_behind = pd.get(20, output_pad_right);
    output_w = pd.get(25, 0);
    output_h = pd.get(26, output_w);
    output_d = pd.get(27, output_w);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    group = pd.get(7, 1);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    return 0;
}